

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::CalcConstraintsJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  size_type sVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  uint i;
  VectorNd *in_stack_00000438;
  VectorNd *in_stack_00000440;
  VectorNd *in_stack_00000448;
  Model *in_stack_00000450;
  uint local_28;
  
  if ((in_R8B & 1) != 0) {
    UpdateKinematicsCustom(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_00000438);
  }
  local_28 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDX + 200));
    if (sVar1 <= local_28) break;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_RDX + 200),(ulong)local_28);
    peVar2 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d853c);
    (*peVar2->_vptr_Constraint[1])
              (0,peVar2,in_RDI,in_RSI,in_RDX + 0x620,in_RCX,in_RDX + 0x620,(uint)(in_R8B & 1));
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsJacobian (
  Model &model,
  const Math::VectorNd &Q,
  ConstraintSet &CS,
  Math::MatrixNd &G,
  bool update_kinematics
)
{
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcConstraintJacobian(model,0,Q,CS.cache.vecNZeros,G,
        CS.cache,update_kinematics);
  }
}